

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> __thiscall
kj::AsyncCapabilityStream::receiveStream(AsyncCapabilityStream *this)

{
  Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> local_20 [2];
  AsyncCapabilityStream *this_local;
  
  this_local = this;
  tryReceiveStream((AsyncCapabilityStream *)local_20);
  Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>::
  then<kj::AsyncCapabilityStream::receiveStream()::__0>
            ((Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>> *)this,
             (Type *)local_20);
  Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::~Promise(local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncCapabilityStream>> AsyncCapabilityStream::receiveStream() {
  return tryReceiveStream()
      .then([](Maybe<Own<AsyncCapabilityStream>>&& result)
            -> Promise<Own<AsyncCapabilityStream>> {
    KJ_IF_SOME(r, result) {
      return kj::mv(r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}